

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Identity.cpp
# Opt level: O0

void test_qclab_qgates_Identity<std::complex<double>>(void)

{
  undefined1 *this;
  allocator<std::complex<double>_> *this_00;
  initializer_list<std::complex<double>_> __l;
  initializer_list<std::complex<double>_> __l_00;
  bool bVar1;
  char *pcVar2;
  reference lhs;
  complex<double> *pcVar3;
  char *in_R9;
  string local_708;
  AssertHelper local_6e8;
  Message local_6e0;
  bool local_6d1;
  undefined1 local_6d0 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_6a0;
  Message local_698;
  bool local_689;
  undefined1 local_688 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_658;
  Message local_650;
  bool local_641;
  undefined1 local_640 [8];
  AssertionResult gtest_ar__4;
  complex<double> local_628;
  undefined8 local_618;
  undefined8 uStack_610;
  iterator local_600;
  size_type local_5f8;
  undefined1 local_5f0 [8];
  V check1;
  V vec1;
  Identity<std::complex<double>_> I0;
  complex<double> local_5a8;
  undefined8 local_598;
  undefined8 uStack_590;
  iterator local_588;
  size_type local_580;
  undefined1 local_578 [8];
  V v1;
  AssertHelper local_540;
  Message local_538;
  bool local_529;
  undefined1 local_528 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_4f8;
  Message local_4f0;
  bool local_4e1;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar__2;
  Identity<std::complex<double>_> I2;
  Message local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  undefined1 local_490 [8];
  AssertionResult gtest_ar_11;
  Message local_478;
  int local_470;
  int local_46c;
  undefined1 local_468 [8];
  AssertionResult gtest_ar_10;
  stringstream qasm;
  ostream local_448 [376];
  AssertHelper local_2d0;
  Message local_2c8;
  complex<double> local_2c0;
  SquareMatrix<std::complex<double>_> local_2b0;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_9;
  Message local_288;
  complex<double> local_280;
  SquareMatrix<std::complex<double>_> local_270;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_8;
  Message local_248;
  complex<double> local_240;
  SquareMatrix<std::complex<double>_> local_230;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_7;
  Message local_208;
  complex<double> local_200;
  SquareMatrix<std::complex<double>_> local_1f0;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_6;
  Message local_1c8;
  int local_1c0;
  int local_1bc;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_5;
  int qnew;
  Message local_198;
  int local_18c;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_4;
  Message local_170;
  int local_164;
  size_type local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_3;
  vector<int,_std::allocator<int>_> qubits;
  Message local_128;
  int local_120;
  int local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_2;
  Message local_100;
  int local_f8;
  int local_f4;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_c0;
  Message local_b8;
  bool local_a9;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_78;
  Message local_70;
  bool local_61;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_;
  Message local_48;
  int local_40 [5];
  int local_2c;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  Identity<std::complex<double>_> I;
  
  qclab::qgates::Identity<std::complex<double>_>::Identity
            ((Identity<std::complex<double>_> *)&gtest_ar.message_);
  local_2c = qclab::qgates::QGate1<std::complex<double>_>::nbQubits
                       ((QGate1<std::complex<double>_> *)&gtest_ar.message_);
  local_40[0] = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_28,"I.nbQubits()","1",&local_2c,local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(&local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  local_61 = qclab::qgates::Identity<std::complex<double>_>::fixed
                       ((Identity<std::complex<double>_> *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_60,&local_61,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_60,(AssertionResult *)"I.fixed()",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,10,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  bVar1 = qclab::qgates::QGate1<std::complex<double>_>::controlled
                    ((QGate1<std::complex<double>_> *)&gtest_ar.message_);
  local_a9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a8,&local_a9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_a8,
               (AssertionResult *)"I.controlled()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0xb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  local_f4 = qclab::qgates::QGate1<std::complex<double>_>::qubit
                       ((QGate1<std::complex<double>_> *)&gtest_ar.message_);
  local_f8 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_f0,"I.qubit()","0",&local_f4,&local_f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0xe,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  qclab::qgates::QGate1<std::complex<double>_>::setQubit
            ((QGate1<std::complex<double>_> *)&gtest_ar.message_,2);
  local_11c = qclab::qgates::QGate1<std::complex<double>_>::qubit
                        ((QGate1<std::complex<double>_> *)&gtest_ar.message_);
  local_120 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_118,"I.qubit()","2",&local_11c,&local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0x10,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,&local_128);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  qclab::qgates::QGate1<std::complex<double>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_3.message_,
             (QGate1<std::complex<double>_> *)&gtest_ar.message_);
  local_160 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)&gtest_ar_3.message_);
  local_164 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_158,"qubits.size()","1",&local_160,&local_164);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0x14,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  lhs = std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)&gtest_ar_3.message_,0);
  local_18c = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_188,"qubits[0]","2",lhs,&local_18c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffe60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0x15,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffe60,&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe60);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 3;
  qclab::qgates::QGate1<std::complex<double>_>::setQubits
            ((QGate1<std::complex<double>_> *)&gtest_ar.message_,
             (int *)((long)&gtest_ar_5.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 4));
  local_1bc = qclab::qgates::QGate1<std::complex<double>_>::qubit
                        ((QGate1<std::complex<double>_> *)&gtest_ar.message_);
  local_1c0 = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1b8,"I.qubit()","3",&local_1bc,&local_1c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0x18,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  qclab::qgates::Identity<std::complex<double>_>::matrix
            ((Identity<std::complex<double>_> *)&local_1f0);
  pcVar3 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()(&local_1f0,0,0);
  std::complex<double>::complex(&local_200,1.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_1e0,"I.matrix()(0,0)","T(1.0)",pcVar3,&local_200);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_1f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0x1b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  qclab::qgates::Identity<std::complex<double>_>::matrix
            ((Identity<std::complex<double>_> *)&local_230);
  pcVar3 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()(&local_230,1,0);
  std::complex<double>::complex(&local_240,0.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_220,"I.matrix()(1,0)","T(0.0)",pcVar3,&local_240);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_230);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0x1c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  qclab::qgates::Identity<std::complex<double>_>::matrix
            ((Identity<std::complex<double>_> *)&local_270);
  pcVar3 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()(&local_270,0,1);
  std::complex<double>::complex(&local_280,0.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_260,"I.matrix()(0,1)","T(0.0)",pcVar3,&local_280);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_270);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    testing::Message::Message(&local_288);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0x1d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  qclab::qgates::Identity<std::complex<double>_>::matrix
            ((Identity<std::complex<double>_> *)&local_2b0);
  pcVar3 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()(&local_2b0,1,1);
  std::complex<double>::complex(&local_2c0,1.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_2a0,"I.matrix()(1,1)","T(1.0)",pcVar3,&local_2c0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_2b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    testing::Message::Message(&local_2c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0x1e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    testing::Message::~Message(&local_2c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  qclab::qgates::QGate1<std::complex<double>_>::print
            ((QGate1<std::complex<double>_> *)&gtest_ar.message_);
  std::__cxx11::stringstream::stringstream((stringstream *)&gtest_ar_10.message_);
  local_46c = qclab::qgates::Identity<std::complex<double>_>::toQASM
                        ((Identity<std::complex<double>_> *)&gtest_ar.message_,local_448,0);
  local_470 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_468,"I.toQASM( qasm )","0",&local_46c,&local_470);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
  if (!bVar1) {
    testing::Message::Message(&local_478);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_468);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0x25,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_478);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_478);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[1],_nullptr>
            ((EqHelper *)local_490,"qasm.str()","\"\"",&local_4b0,(char (*) [1])0x69c4e1);
  std::__cxx11::string::~string((string *)&local_4b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
  if (!bVar1) {
    testing::Message::Message(&local_4b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_490);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&I2.super_QGate1<std::complex<double>_>.qubit_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&I2.super_QGate1<std::complex<double>_>.qubit_,&local_4b8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&I2.super_QGate1<std::complex<double>_>.qubit_);
    testing::Message::~Message(&local_4b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
  qclab::qgates::Identity<std::complex<double>_>::Identity
            ((Identity<std::complex<double>_> *)&gtest_ar__2.message_);
  local_4e1 = qclab::QObject<std::complex<double>_>::operator==
                        ((QObject<std::complex<double>_> *)&gtest_ar.message_,
                         (QObject<std::complex<double>_> *)&gtest_ar__2.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4e0,&local_4e1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
  if (!bVar1) {
    testing::Message::Message(&local_4f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_4e0,(AssertionResult *)"I == I2",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0x2a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4f8,&local_4f0);
    testing::internal::AssertHelper::~AssertHelper(&local_4f8);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_4f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
  bVar1 = qclab::QObject<std::complex<double>_>::operator!=
                    ((QObject<std::complex<double>_> *)&gtest_ar.message_,
                     (QObject<std::complex<double>_> *)&gtest_ar__2.message_);
  local_529 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_528,&local_529,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_528);
  if (!bVar1) {
    testing::Message::Message(&local_538);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &v1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_528,
               (AssertionResult *)"I != I2","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_540,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_540,&local_538);
    testing::internal::AssertHelper::~AssertHelper(&local_540);
    std::__cxx11::string::~string
              ((string *)
               &v1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_538);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_528);
  local_598 = 0x3ff0000000000000;
  uStack_590 = 0;
  local_5a8._M_value._0_8_ = 0;
  local_5a8._M_value._8_8_ = 0;
  local_588 = &local_5a8;
  local_580 = 2;
  this = &I0.super_QGate1<std::complex<double>_>.field_0xf;
  std::allocator<std::complex<double>_>::allocator((allocator<std::complex<double>_> *)this);
  __l_00._M_len = local_580;
  __l_00._M_array = local_588;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_578,
             __l_00,(allocator_type *)this);
  std::allocator<std::complex<double>_>::~allocator
            ((allocator<std::complex<double>_> *)&I0.super_QGate1<std::complex<double>_>.field_0xf);
  qclab::qgates::Identity<std::complex<double>_>::Identity
            ((Identity<std::complex<double>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_578);
  qclab::qgates::Identity<std::complex<double>_>::apply
            ((Identity<std::complex<double>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,1,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_618 = 0x3ff0000000000000;
  uStack_610 = 0;
  local_628._M_value._0_8_ = 0;
  local_628._M_value._8_8_ = 0;
  local_600 = &local_628;
  local_5f8 = 2;
  this_00 = (allocator<std::complex<double>_> *)
            ((long)&gtest_ar__4.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 7);
  std::allocator<std::complex<double>_>::allocator(this_00);
  __l._M_len = local_5f8;
  __l._M_array = local_600;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_5f0,__l,
             this_00);
  std::allocator<std::complex<double>_>::~allocator
            ((allocator<std::complex<double>_> *)
             ((long)&gtest_ar__4.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_641 = std::operator==((vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)&check1.
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)local_5f0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_640,&local_641,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_640);
  if (!bVar1) {
    testing::Message::Message(&local_650);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_640,
               (AssertionResult *)"vec1 == check1","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=(&local_658,&local_650);
    testing::internal::AssertHelper::~AssertHelper(&local_658);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_650);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_640);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_578);
  qclab::qgates::Identity<std::complex<double>_>::apply
            ((Identity<std::complex<double>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,Trans,1,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_689 = std::operator==((vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)&check1.
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)local_5f0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_688,&local_689,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_688);
  if (!bVar1) {
    testing::Message::Message(&local_698);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_688,
               (AssertionResult *)"vec1 == check1","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6a0,&local_698);
    testing::internal::AssertHelper::~AssertHelper(&local_6a0);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_698);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_688);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_578);
  qclab::qgates::Identity<std::complex<double>_>::apply
            ((Identity<std::complex<double>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,ConjTrans,1,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_6d1 = std::operator==((vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)&check1.
                                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)local_5f0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6d0,&local_6d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d0);
  if (!bVar1) {
    testing::Message::Message(&local_6e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_708,(internal *)local_6d0,(AssertionResult *)"vec1 == check1","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/Identity.cpp"
               ,0x4c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6e8,&local_6e0);
    testing::internal::AssertHelper::~AssertHelper(&local_6e8);
    std::__cxx11::string::~string((string *)&local_708);
    testing::Message::~Message(&local_6e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d0);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_5f0);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
             &check1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::Identity<std::complex<double>_>::~Identity
            ((Identity<std::complex<double>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_578);
  qclab::qgates::Identity<std::complex<double>_>::~Identity
            ((Identity<std::complex<double>_> *)&gtest_ar__2.message_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&gtest_ar_10.message_);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_3.message_);
  qclab::qgates::Identity<std::complex<double>_>::~Identity
            ((Identity<std::complex<double>_> *)&gtest_ar.message_);
  return;
}

Assistant:

void test_qclab_qgates_Identity() {

  qclab::qgates::Identity< T >  I ;

  EXPECT_EQ( I.nbQubits() , 1 ) ;   // nbQubits
  EXPECT_TRUE( I.fixed() ) ;        // fixed
  EXPECT_FALSE( I.controlled() ) ;  // controlled

  // qubit
  EXPECT_EQ( I.qubit() , 0 ) ;
  I.setQubit( 2 ) ;
  EXPECT_EQ( I.qubit() , 2 ) ;

  // qubits
  auto qubits = I.qubits() ;
  EXPECT_EQ( qubits.size() , 1 ) ;
  EXPECT_EQ( qubits[0] , 2 ) ;
  int qnew = 3 ;
  I.setQubits( &qnew ) ;
  EXPECT_EQ( I.qubit() , 3 ) ;

  // matrix
  EXPECT_EQ( I.matrix()(0,0) , T(1.0) ) ;
  EXPECT_EQ( I.matrix()(1,0) , T(0.0) ) ;
  EXPECT_EQ( I.matrix()(0,1) , T(0.0) ) ;
  EXPECT_EQ( I.matrix()(1,1) , T(1.0) ) ;

  // print
  I.print() ;

  // toQASM
  std::stringstream qasm ;
  EXPECT_EQ( I.toQASM( qasm ) , 0 ) ;
  EXPECT_EQ( qasm.str() , "" ) ;

  // operators == and !=
  qclab::qgates::Identity< T > I2 ;
  EXPECT_TRUE( I == I2 ) ;
  EXPECT_FALSE( I != I2 ) ;

  // apply
  {
    using V = std::vector< T > ;
    const V v1 = { 0 , 1 } ;

    qclab::qgates::Identity< T >  I0( 0 ) ;

    // nbQubits = 1
    auto vec1 = v1 ;
    I0.apply( qclab::Op::NoTrans , 1 , vec1 ) ;
    V check1 = { 0 , 1 } ;
    EXPECT_TRUE( vec1 == check1 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec1 = v1 ; T* vec1_ = vec1.data() ;
    #pragma omp target data map(tofrom:vec1_[0:2])
    { I0.apply_device( qclab::Op::NoTrans , 1 , vec1_ ) ; }
    EXPECT_TRUE( vec1 == check1 ) ;
  #endif

    vec1 = v1 ;
    I0.apply( qclab::Op::Trans , 1 , vec1 ) ;
    EXPECT_TRUE( vec1 == check1 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec1 = v1 ;
    #pragma omp target data map(tofrom:vec1_[0:2])
    { I0.apply_device( qclab::Op::Trans , 1 , vec1_ ) ; }
    EXPECT_TRUE( vec1 == check1 ) ;
  #endif

    vec1 = v1 ;
    I0.apply( qclab::Op::ConjTrans , 1 , vec1 ) ;
    EXPECT_TRUE( vec1 == check1 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec1 = v1 ;
    #pragma omp target data map(tofrom:vec1_[0:2])
    { I0.apply_device( qclab::Op::ConjTrans , 1 , vec1_ ) ; }
    EXPECT_TRUE( vec1 == check1 ) ;
  #endif
  }

}